

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

void __thiscall QTextBrowser::doSetSource(QTextBrowser *this,QUrl *url,ResourceType type)

{
  QStack<QTextBrowserPrivate::HistoryEntry> *pQVar1;
  QTextBrowserPrivate *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  QArrayData *pQVar4;
  qsizetype qVar5;
  char cVar6;
  iterator iVar7;
  long in_FS_OFFSET;
  HistoryEntry historyEntry;
  bool local_111;
  value_type local_110;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 local_98 [8];
  QArrayData *pQStack_90;
  char16_t *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  bool *pbStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextBrowserPrivate **)
             &(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
  ;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBrowserPrivate::createHistoryEntry((HistoryEntry *)local_98,this_00);
  QTextBrowserPrivate::setSource(this_00,url,type);
  cVar6 = QUrl::isValid();
  if (cVar6 == '\0') goto LAB_004af290;
  pQVar1 = &this_00->stack;
  if ((this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0) {
    iVar7 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    cVar6 = comparesEqual(&iVar7.i[-1].url,url);
    if (cVar6 != '\0') goto LAB_004af290;
  }
  if ((this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0) {
    iVar7 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    QUrl::operator=(&iVar7.i[-1].url,(QUrl *)local_98);
    QString::operator=(&iVar7.i[-1].title,(QString *)(local_98 + 8));
    *(undefined1 **)&iVar7.i[-1].hpos = local_78;
    *(undefined1 **)&iVar7.i[-1].focusIndicatorPosition = puStack_70;
    iVar7.i[-1].type = (ResourceType)local_68;
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl((QUrl *)local_d8);
  local_d8._24_8_ = 0;
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0;
  local_d8._8_8_ = (QArrayData *)0x0;
  local_d8._16_8_ = (char16_t *)0x0;
  puStack_b0 = (undefined1 *)0xffffffffffffffff;
  local_a8 = (undefined1 *)((ulong)local_a8 & 0xffffffff00000000);
  QUrl::operator=((QUrl *)local_d8,url);
  local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,this_00->currentType);
  QTextEdit::document(&this->super_QTextEdit);
  QTextDocument::metaInformation((MetaInformation)&local_58);
  qVar5 = local_48;
  pQVar4 = local_58;
  uVar3 = local_d8._16_8_;
  uVar2 = local_d8._8_8_;
  local_58 = (QArrayData *)local_d8._8_8_;
  local_d8._8_8_ = pQVar4;
  local_d8._16_8_ = pbStack_50;
  pbStack_50 = (bool *)uVar3;
  local_48 = local_d8._24_8_;
  local_d8._24_8_ = qVar5;
  if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
    }
  }
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0;
  QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
  emplace<QTextBrowserPrivate::HistoryEntry_const&>
            ((QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *)pQVar1,
             (this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size,
             (HistoryEntry *)local_d8);
  QList<QTextBrowserPrivate::HistoryEntry>::end
            (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
  local_111 = 1 < (ulong)(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
  local_58 = (QArrayData *)0x0;
  pbStack_50 = &local_111;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58);
  pQVar1 = &this_00->forwardStack;
  if ((this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size == 0) {
LAB_004af20f:
    QList<QTextBrowserPrivate::HistoryEntry>::clear
              (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    local_111 = false;
  }
  else {
    iVar7 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    cVar6 = comparesEqual(&iVar7.i[-1].url,url);
    if (cVar6 == '\0') goto LAB_004af20f;
    QList<QTextBrowserPrivate::HistoryEntry>::takeLast
              (&local_110,&pQVar1->super_QList<QTextBrowserPrivate::HistoryEntry>);
    if (&(local_110.title.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_110.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_110.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_110.title.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_110.title.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::~QUrl(&local_110.url);
    local_111 = (this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size != 0;
  }
  local_58 = (QArrayData *)0x0;
  pbStack_50 = &local_111;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_58);
  QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
  if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._8_8_,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)local_d8);
LAB_004af290:
  if (pQStack_90 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_90,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::doSetSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_D(QTextBrowser);

    const QTextBrowserPrivate::HistoryEntry historyEntry = d->createHistoryEntry();

    d->setSource(url, type);

    if (!url.isValid())
        return;

    // the same url you are already watching?
    if (!d->stack.isEmpty() && d->stack.top().url == url)
        return;

    if (!d->stack.isEmpty())
        d->stack.top() = historyEntry;

    QTextBrowserPrivate::HistoryEntry entry;
    entry.url = url;
    entry.type = d->currentType;
    entry.title = documentTitle();
    entry.hpos = 0;
    entry.vpos = 0;
    d->stack.push(entry);

    emit backwardAvailable(d->stack.size() > 1);

    if (!d->forwardStack.isEmpty() && d->forwardStack.top().url == url) {
        d->forwardStack.pop();
        emit forwardAvailable(d->forwardStack.size() > 0);
    } else {
        d->forwardStack.clear();
        emit forwardAvailable(false);
    }

    emit historyChanged();
}